

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::start_prediction_work(Solver *this)

{
  _Vector_base<float,_std::allocator<float>_> local_80;
  Predictor pdc;
  
  std::__cxx11::string::string((string *)&pdc,"Start to predict ...",(allocator *)&local_80);
  Color::print_action((string *)&pdc);
  std::__cxx11::string::~string((string *)&pdc);
  pdc.out_file_._M_dataplus._M_p = (pointer)&pdc.out_file_.field_2;
  pdc.out_file_._M_string_length = 0;
  pdc.out_file_.field_2._M_local_buf[0] = '\0';
  pdc.out_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pdc.out_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pdc.out_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Predictor::Initialize
            (&pdc,*(this->reader_).
                   super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                   super__Vector_impl_data._M_start,this->model_,this->loss_,
             &(this->hyper_param_).output_file,(this->hyper_param_).sign,
             (this->hyper_param_).sigmoid,(this->hyper_param_).res_out);
  Predictor::Predict(&pdc);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_80,&pdc.out_);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&this->out_,&local_80);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_80);
  Predictor::~Predictor(&pdc);
  return;
}

Assistant:

void Solver::start_prediction_work() {
  Color::print_action("Start to predict ...");
  Predictor pdc;
  pdc.Initialize(reader_[0],
                 model_,
                 loss_,
                 hyper_param_.output_file,
                 hyper_param_.sign,
                 hyper_param_.sigmoid,
                 hyper_param_.res_out);
  // Predict and write output
  pdc.Predict();
  this->out_ = pdc.GetResult();
}